

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

int cvui::internal::iarea(int theX,int theY,int theWidth,int theHeight)

{
  bool bVar1;
  cvui_context_t *pcVar2;
  Rect_<int> local_6c;
  int local_58;
  bool aMouseIsOver;
  int aRet;
  allocator<char> local_41;
  String local_40;
  cvui_mouse_t *local_20;
  cvui_mouse_t *aMouse;
  int theHeight_local;
  int theWidth_local;
  int theY_local;
  int theX_local;
  
  aMouse._0_4_ = theHeight;
  aMouse._4_4_ = theWidth;
  theHeight_local = theY;
  theWidth_local = theX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  pcVar2 = getContext(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_58 = 5;
  local_20 = &pcVar2->mouse;
  cv::Rect_<int>::Rect_(&local_6c,theWidth_local,theHeight_local,aMouse._4_4_,(int)aMouse);
  bVar1 = cv::Rect_<int>::contains(&local_6c,&local_20->position);
  if (bVar1) {
    if (((local_20->anyButton).pressed & 1U) == 0) {
      local_58 = 4;
    }
    else {
      local_58 = 2;
    }
  }
  if ((bVar1) && (((local_20->anyButton).justReleased & 1U) != 0)) {
    local_58 = 3;
  }
  return local_58;
}

Assistant:

int iarea(int theX, int theY, int theWidth, int theHeight) {
		cvui_mouse_t& aMouse = internal::getContext().mouse;

		// By default, return that the mouse is out of the interaction area.
		int aRet = cvui::OUT;

		// Check if the mouse is over the interaction area.
		bool aMouseIsOver = cv::Rect(theX, theY, theWidth, theHeight).contains(aMouse.position);

		if (aMouseIsOver) {
			if (aMouse.anyButton.pressed) {
				aRet = cvui::DOWN;
			} else {
				aRet = cvui::OVER;
			}
		}

		// Tell if the button was clicked or not
		if (aMouseIsOver && aMouse.anyButton.justReleased) {
			aRet = cvui::CLICK;
		}

		return aRet;
	}